

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::VertexIDCase::renderReference
          (VertexIDCase *this,PixelBufferAccess *dst,int numVertices,deUint16 *indices,
          Vec4 *positions,Vec4 *colors)

{
  Renderer referenceRenderer;
  VertexAttrib local_348;
  undefined8 uStack_320;
  undefined8 local_318;
  Vec4 *pVStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  Program local_2f8;
  DrawIndices local_2e0;
  VertexIDReferenceShader referenceShader;
  DrawCommand local_260;
  PrimitiveList local_230;
  RenderTarget referenceTarget;
  RenderState referenceState;
  
  rr::Renderer::Renderer(&referenceRenderer);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&referenceShader,dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&referenceTarget,
             (MultisamplePixelBufferAccess *)&referenceShader);
  local_348.type = VERTEXATTRIBTYPE_FLOAT;
  local_348.size = 0;
  local_348.pointer = (void *)0x3f80000000000000;
  rr::RenderState::RenderState
            (&referenceState,(ViewportState *)&local_348,VIEWPORTORIENTATION_LOWER_LEFT);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&referenceShader,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_348);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_260);
  rr::RenderTarget::RenderTarget
            (&referenceTarget,(MultisamplePixelBufferAccess *)&referenceShader,
             (MultisamplePixelBufferAccess *)&local_348,(MultisamplePixelBufferAccess *)&local_260);
  VertexIDReferenceShader::VertexIDReferenceShader(&referenceShader);
  local_348.generic.v._0_8_ = 0;
  local_348.generic.v._8_8_ = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_348.type = VERTEXATTRIBTYPE_FLOAT;
  local_348.size = 4;
  local_348.stride = 0;
  local_348.instanceDivisor = 0;
  uStack_320 = 0x400000000;
  local_318 = 0;
  local_2f8.fragmentShader = &referenceShader.super_FragmentShader;
  local_2f8.geometryShader = (GeometryShader *)0x0;
  local_348.pointer = positions;
  pVStack_310 = colors;
  local_2f8.vertexShader = &referenceShader.super_VertexShader;
  rr::DrawIndices::DrawIndices(&local_2e0,indices,0);
  rr::PrimitiveList::PrimitiveList(&local_230,PRIMITIVETYPE_TRIANGLES,numVertices,&local_2e0);
  local_260.state = &referenceState;
  local_260.program = &local_2f8;
  local_260.numVertexAttribs = 2;
  local_260.renderTarget = &referenceTarget;
  local_260.vertexAttribs = &local_348;
  local_260.primitives = &local_230;
  rr::Renderer::draw(&referenceRenderer,&local_260);
  VertexIDReferenceShader::~VertexIDReferenceShader(&referenceShader);
  rr::Renderer::~Renderer(&referenceRenderer);
  return;
}

Assistant:

void VertexIDCase::renderReference (const tcu::PixelBufferAccess& dst, const int numVertices, const deUint16* const indices, const tcu::Vec4* const positions, const tcu::Vec4* const colors)
{
	const rr::Renderer				referenceRenderer;
	const rr::RenderState			referenceState		((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst)));
	const rr::RenderTarget			referenceTarget		(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst));
	const VertexIDReferenceShader	referenceShader;
	      rr::VertexAttrib			attribs[2];

	attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[0].size				= 4;
	attribs[0].stride			= 0;
	attribs[0].instanceDivisor	= 0;
	attribs[0].pointer			= positions;

	attribs[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[1].size				= 4;
	attribs[1].stride			= 0;
	attribs[1].instanceDivisor	= 0;
	attribs[1].pointer			= colors;

	referenceRenderer.draw(
		rr::DrawCommand(
			referenceState,
			referenceTarget,
			rr::Program(&referenceShader, &referenceShader),
			2,
			attribs,
			rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, numVertices, rr::DrawIndices(indices))));
}